

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_int_t ngx_rstrncasecmp(u_char *s1,u_char *s2,size_t n)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  if (n != 0) {
    do {
      bVar1 = s1[n - 1];
      bVar2 = bVar1 - 0x20;
      if (0x19 < (byte)(bVar1 + 0x9f)) {
        bVar2 = bVar1;
      }
      bVar1 = s2[n - 1];
      bVar3 = bVar1 - 0x20;
      if (0x19 < (byte)(bVar1 + 0x9f)) {
        bVar3 = bVar1;
      }
      if (bVar2 != bVar3) {
        return (ulong)bVar2 - (ulong)bVar3;
      }
      n = n - 1;
    } while (n != 0);
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_rstrncasecmp(u_char *s1, u_char *s2, size_t n)
{
    u_char  c1, c2;

    if (n == 0) {
        return 0;
    }

    n--;

    for ( ;; ) {
        c1 = s1[n];
        if (c1 >= 'a' && c1 <= 'z') {
            c1 -= 'a' - 'A';
        }

        c2 = s2[n];
        if (c2 >= 'a' && c2 <= 'z') {
            c2 -= 'a' - 'A';
        }

        if (c1 != c2) {
            return c1 - c2;
        }

        if (n == 0) {
            return 0;
        }

        n--;
    }
}